

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

Memory __thiscall
google::protobuf::internal::SerialArena::Free<google::protobuf::internal::GetDeallocator>
          (SerialArena *this,GetDeallocator deallocator)

{
  Block *pBVar1;
  size_t sVar2;
  Block *pBVar3;
  Memory MVar4;
  
  pBVar1 = this->head_;
  sVar2 = pBVar1->size;
  for (pBVar3 = pBVar1->next; pBVar3 != (Block *)0x0; pBVar3 = pBVar3->next) {
    if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
      operator_delete(pBVar1);
    }
    else {
      (*deallocator.dealloc_)(pBVar1,sVar2);
    }
    *deallocator.space_allocated_ = *deallocator.space_allocated_ + sVar2;
    sVar2 = pBVar3->size;
    pBVar1 = pBVar3;
  }
  MVar4.size = sVar2;
  MVar4.ptr = pBVar1;
  return MVar4;
}

Assistant:

SerialArena::Memory SerialArena::Free(Deallocator deallocator) {
  Block* b = head_;
  Memory mem = {b, b->size};
  while (b->next) {
    b = b->next;  // We must first advance before deleting this block
    deallocator(mem);
    mem = {b, b->size};
  }
  return mem;
}